

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

HelicsBool helicsFederateGetFlagOption(HelicsFederate fed,int flag,HelicsError *err)

{
  element_type *peVar1;
  uint uVar2;
  FedObject *pFVar3;
  
  pFVar3 = helics::getFedObject(fed,err);
  uVar2 = 0;
  if ((pFVar3 != (FedObject *)0x0) &&
     (peVar1 = (pFVar3->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, uVar2 = 0, peVar1 != (element_type *)0x0)) {
    uVar2 = (*peVar1->_vptr_Federate[8])(peVar1,flag);
    uVar2 = uVar2 & 0xff;
  }
  return uVar2;
}

Assistant:

HelicsBool helicsFederateGetFlagOption(HelicsFederate fed, int flag, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_FALSE;
    }
    try {
        const bool res = fedObj->getFlagOption(flag);
        return (res) ? HELICS_TRUE : HELICS_FALSE;
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_FALSE;
    }
    // LCOV_EXCL_STOP
}